

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

void __thiscall QRegularExpressionPrivate::getPatternInfo(QRegularExpressionPrivate *this)

{
  int iVar1;
  long in_FS_OFFSET;
  uint hasJOptionChanged;
  uint patternNewlineSetting;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pcre2_pattern_info_16(this->compiledPattern,4,&this->capturingCount);
  patternNewlineSetting = 0xaaaaaaaa;
  iVar1 = pcre2_pattern_info_16(this->compiledPattern,0x14);
  if (iVar1 != 0) {
    pcre2_config_16(5,&patternNewlineSetting);
  }
  this->usingCrLfNewlines = patternNewlineSetting - 3 < 3;
  pcre2_pattern_info_16(this->compiledPattern,9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRegularExpressionPrivate::getPatternInfo()
{
    Q_ASSERT(compiledPattern);

    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_CAPTURECOUNT, &capturingCount);

    // detect the settings for the newline
    unsigned int patternNewlineSetting;
    if (pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NEWLINE, &patternNewlineSetting) != 0) {
        // no option was specified in the regexp, grab PCRE build defaults
        pcre2_config_16(PCRE2_CONFIG_NEWLINE, &patternNewlineSetting);
    }

    usingCrLfNewlines = (patternNewlineSetting == PCRE2_NEWLINE_CRLF) ||
            (patternNewlineSetting == PCRE2_NEWLINE_ANY) ||
            (patternNewlineSetting == PCRE2_NEWLINE_ANYCRLF);

    unsigned int hasJOptionChanged;
    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_JCHANGED, &hasJOptionChanged);
    if (Q_UNLIKELY(hasJOptionChanged)) {
        qWarning("QRegularExpressionPrivate::getPatternInfo(): the pattern '%ls'\n    is using the (?J) option; duplicate capturing group names are not supported by Qt",
                 qUtf16Printable(pattern));
    }
}